

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.cxx
# Opt level: O2

double __thiscall
trento::MonteCarloCrossSection::operator()(MonteCarloCrossSection *this,double sigma_partonic)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  double *pdVar6;
  out_of_range *this_00;
  int iVar7;
  allocator_type *__a;
  allocator_type *__a_00;
  iterator __end2;
  iterator __begin3;
  pointer pCVar8;
  iterator __begin2;
  pointer pCVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 in_XMM5 [16];
  double local_108;
  vector<Constituent,_std::allocator<Constituent>_> nucleonB;
  vector<Constituent,_std::allocator<Constituent>_> nucleonA;
  double local_88;
  CyclicNormal<double> cyclic_normal;
  undefined1 extraout_var [56];
  
  random::CyclicNormal<double>::CyclicNormal
            (&cyclic_normal,0.0,this->sampling_width_,this->cache_size,this->n_loops);
  std::
  vector<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent,std::allocator<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent>>
  ::operator()(&nucleonA,this->constituent_number_,__a);
  std::
  vector<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent,std::allocator<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent>>
  ::operator()(&nucleonB,this->constituent_number_,__a_00);
  dVar1 = this->max_impact_;
  auVar13._8_8_ = in_XMM0_Qb;
  auVar13._0_8_ = sigma_partonic;
  dVar20 = 0.0;
  uVar10 = 0;
  iVar7 = 0;
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  auVar12 = vxorpd_avx512vl(auVar13,auVar12);
  dVar11 = 0.0;
  while( true ) {
    if (this->n_max <= uVar10) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range
                (this_00,
                 "Partonic cross section failed to converge       -- check nucleon width, constituent width, and constituent number"
                );
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    dVar16 = this->max_impact_;
    auVar18._0_8_ = random::canonical<double>();
    auVar18._8_56_ = extraout_var;
    if (auVar18._0_8_ < 0.0) {
      dVar14 = sqrt(auVar18._0_8_);
    }
    else {
      auVar13 = vsqrtsd_avx(auVar18._0_16_,auVar18._0_16_);
      dVar14 = auVar13._0_8_;
    }
    for (pCVar9 = nucleonA.super__Vector_base<Constituent,_std::allocator<Constituent>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar8 = nucleonB.super__Vector_base<Constituent,_std::allocator<Constituent>_>._M_impl.
                 super__Vector_impl_data._M_start,
        pCVar9 != nucleonA.super__Vector_base<Constituent,_std::allocator<Constituent>_>._M_impl.
                  super__Vector_impl_data._M_finish; pCVar9 = pCVar9 + 1) {
      pdVar6 = random::CyclicNormal<double>::operator()(&cyclic_normal);
      pCVar9->x = *pdVar6;
      pdVar6 = random::CyclicNormal<double>::operator()(&cyclic_normal);
      pCVar9->y = *pdVar6;
    }
    for (; pCVar8 != nucleonB.super__Vector_base<Constituent,_std::allocator<Constituent>_>._M_impl.
                     super__Vector_impl_data._M_finish; pCVar8 = pCVar8 + 1) {
      pdVar6 = random::CyclicNormal<double>::operator()(&cyclic_normal);
      pCVar8->x = *pdVar6;
      pdVar6 = random::CyclicNormal<double>::operator()(&cyclic_normal);
      pCVar8->y = *pdVar6;
    }
    local_108 = 0.0;
    for (pCVar9 = nucleonA.super__Vector_base<Constituent,_std::allocator<Constituent>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar8 = nucleonB.super__Vector_base<Constituent,_std::allocator<Constituent>_>._M_impl.
                 super__Vector_impl_data._M_start,
        pCVar9 != nucleonA.super__Vector_base<Constituent,_std::allocator<Constituent>_>._M_impl.
                  super__Vector_impl_data._M_finish; pCVar9 = pCVar9 + 1) {
      for (; pCVar8 != nucleonB.super__Vector_base<Constituent,_std::allocator<Constituent>_>.
                       _M_impl.super__Vector_impl_data._M_finish; pCVar8 = pCVar8 + 1) {
        dVar2 = pCVar9->y - pCVar8->y;
        dVar15 = (pCVar9->x - pCVar8->x) + dVar16 * dVar14;
        dVar15 = exp(((dVar15 * dVar15 + dVar2 * dVar2) * -0.25) / this->constituent_width_sq_);
        local_108 = local_108 + dVar15;
      }
    }
    local_88 = auVar12._0_8_;
    auVar13 = vcvtusi2sd_avx512f(in_XMM5,this->constituent_number_);
    dVar16 = exp(((local_88 * this->prefactor_) / (auVar13._0_8_ + auVar13._0_8_)) * local_108);
    auVar13 = vcvtusi2sd_avx512f(in_XMM5,uVar10);
    dVar20 = dVar20 + dVar16;
    dVar16 = (1.0 - dVar20 / auVar13._0_8_) * dVar1 * dVar1 * 3.141592653589793;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = this->tolerance;
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar16 - dVar11;
    auVar13 = vandpd_avx512vl(auVar17,auVar5);
    iVar7 = iVar7 + 1;
    if (this->tolerance <= auVar13._0_8_) {
      iVar7 = 0;
    }
    if (this->n_pass < iVar7) break;
    uVar3 = vcmpsd_avx512f(auVar13,auVar19,1);
    bVar4 = (bool)((byte)uVar3 & 1);
    uVar10 = uVar10 + 1;
    dVar11 = (double)((ulong)bVar4 * (long)dVar11 + (ulong)!bVar4 * (long)dVar16);
  }
  std::vector<Constituent,_std::allocator<Constituent>_>::~vector(&nucleonB);
  std::vector<Constituent,_std::allocator<Constituent>_>::~vector(&nucleonA);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&cyclic_normal);
  return dVar16;
}

Assistant:

double MonteCarloCrossSection::operator() (const double sigma_partonic) const {

  random::CyclicNormal<> cyclic_normal{
    0., sampling_width_, cache_size, n_loops
  };

  struct Constituent {
    double x, y;
  };

  std::vector<Constituent> nucleonA(constituent_number_);
  std::vector<Constituent> nucleonB(constituent_number_);

  auto max_impact_sq_ = sqr(max_impact_);
  double ref_cross_section = 0.;
  double prob_miss = 0.;
  int pass_tolerance = 0;

  for (std::size_t n = 0; n < n_max; ++n) {
    // Sample b from P(b)db = 2*pi*b.
    auto b = max_impact_ * std::sqrt(random::canonical<double>());

    for (auto&& q : nucleonA) {
      q.x = cyclic_normal(random::engine);
      q.y = cyclic_normal(random::engine);
    }

    for (auto&& q : nucleonB) {
      q.x = cyclic_normal(random::engine);
      q.y = cyclic_normal(random::engine);
    }

    auto overlap = 0.;
    for (auto&& qA : nucleonA) {
      for (auto&& qB : nucleonB) {
        auto distance_sq = sqr(qA.x - qB.x + b) + sqr(qA.y - qB.y);
        overlap += std::exp(-.25*distance_sq/constituent_width_sq_);
      }
    }

    prob_miss +=
      std::exp(-sigma_partonic * prefactor_/(2.*constituent_number_) * overlap);

    auto prob_hit = 1. - (prob_miss/n);
    auto cross_section = M_PI*max_impact_sq_*prob_hit;

    auto update_difference = std::abs(cross_section - ref_cross_section);

    if (update_difference < tolerance) {
      ++pass_tolerance;
    } else {
      pass_tolerance = 0;
      ref_cross_section = cross_section;
    }

    if (pass_tolerance > n_pass){
      return cross_section;
    }
  }

  throw std::out_of_range{
    "Partonic cross section failed to converge \
      -- check nucleon width, constituent width, and constituent number"};
}